

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  ulong uVar1;
  ulong uVar2;
  real *prVar3;
  real *prVar4;
  real *prVar5;
  uint __line;
  char *__assertion;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  
  uVar1 = A->m_;
  if (uVar1 == this->m_) {
    uVar2 = A->n_;
    if (uVar2 == vec->m_) {
      prVar3 = this->data_;
      lVar6 = 0;
      for (uVar7 = 0; uVar7 != (~((long)uVar1 >> 0x3f) & uVar1); uVar7 = uVar7 + 1) {
        prVar3[uVar7] = 0.0;
        prVar4 = vec->data_;
        prVar5 = A->data_;
        auVar9 = ZEXT816(0) << 0x40;
        for (uVar8 = 0; (~((long)uVar2 >> 0x3f) & uVar2) != uVar8; uVar8 = uVar8 + 1) {
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416(*(uint *)((long)prVar5 + uVar8 * 4 + lVar6)),
                                   ZEXT416((uint)prVar4[uVar8]));
          prVar3[uVar7] = auVar9._0_4_;
        }
        lVar6 = lVar6 + uVar2 * 4;
      }
      return;
    }
    __assertion = "A.n_ == vec.m_";
    __line = 0x44;
  }
  else {
    __assertion = "A.m_ == m_";
    __line = 0x43;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,__line,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.m_ == m_);
  assert(A.n_ == vec.m_);
  for (int64_t i = 0; i < m_; i++) {
    data_[i] = 0.0;
    for (int64_t j = 0; j < A.n_; j++) {
      data_[i] += A.data_[i * A.n_ + j] * vec.data_[j];
    }
  }
}